

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSComputerRS232Port.h
# Opt level: O0

int WaitForComputerRS232Port(HANDLE hDev,int timeout,int checkingperiod)

{
  int iVar1;
  fd_set *__arr;
  undefined1 auStack_b8 [4];
  uint __i;
  timeval tv;
  undefined1 local_a0 [4];
  int iResult;
  fd_set dev_set;
  int checkingperiod_local;
  int timeout_local;
  HANDLE hDev_local;
  
  dev_set.fds_bits[0xf]._4_4_ = timeout;
  dev_set.fds_bits[0xf]._0_4_ = checkingperiod;
  tv.tv_usec._4_4_ = 0xffffffff;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    *(undefined8 *)(local_a0 + (ulong)__arr._4_4_ * 8) = 0;
  }
  *(ulong *)(local_a0 + ((long)hDev / 0x40) * 8) =
       1L << ((byte)((long)hDev % 0x40) & 0x3f) | *(ulong *)(local_a0 + ((long)hDev / 0x40) * 8);
  _auStack_b8 = (long)(dev_set.fds_bits[0xf]._4_4_ / 1000);
  tv.tv_sec = (__time_t)((dev_set.fds_bits[0xf]._4_4_ % 1000) * 1000);
  iVar1 = select((int)hDev + 1,(fd_set *)local_a0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)auStack_b8)
  ;
  *(ulong *)(local_a0 + ((long)hDev / 0x40) * 8) =
       (1L << ((byte)((long)hDev % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
       *(ulong *)(local_a0 + ((long)hDev / 0x40) * 8);
  if (iVar1 == -1) {
    hDev_local._4_4_ = 1;
  }
  else if (iVar1 == 0) {
    hDev_local._4_4_ = 2;
  }
  else {
    hDev_local._4_4_ = 0;
  }
  return hDev_local._4_4_;
}

Assistant:

inline int WaitForComputerRS232Port(HANDLE hDev, int timeout, int checkingperiod)
{
#ifdef _WIN32
	COMSTAT stats;
	CHRONO chrono;

	StartChrono(&chrono);
	do
	{
		memset(&stats, 0, sizeof(COMSTAT));
		if (ClearCommError(hDev, NULL, &stats))
		{
			if (stats.cbInQue <= 0) mSleep(checkingperiod);
			else
			{
				StopChronoQuick(&chrono);
				return EXIT_SUCCESS;
			}
		}
		else
		{
			StopChronoQuick(&chrono);
			PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("WaitForComputerRS232Port error (%s) : %s"
				"(hDev=%#x, timeout=%d, checkingperiod=%d)\n",
				strtime_m(),
				GetLastErrorMsg(),
				hDev, timeout, checkingperiod));
			return EXIT_FAILURE;
		}
	} while (GetTimeElapsedChronoQuick(&chrono) <= timeout);
	StopChronoQuick(&chrono);
	return EXIT_TIMEOUT;
#else
#ifdef DISABLE_SELECT_OSCOMPUTERRS232PORT
	CHRONO chrono;

	StartChrono(&chrono);
	do
	{
		int bytes_avail = 0;

		if (ioctl((intptr_t)hDev, FIONREAD, &bytes_avail) == EXIT_SUCCESS)
		{
			if (bytes_avail <= 0) mSleep(checkingperiod);
			else
			{
				StopChronoQuick(&chrono);
				return EXIT_SUCCESS;
			}
		}
		else
		{
			StopChronoQuick(&chrono);
			PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("WaitForComputerRS232Port error (%s) : (FIONREAD) %s"
				"(hDev=%#x, timeout=%d, checkingperiod=%d)\n",
				strtime_m(),
				GetLastErrorMsg(),
				hDev, timeout, checkingperiod));
			return EXIT_FAILURE;
		}
	} while (GetTimeElapsedChronoQuick(&chrono) <= timeout);
	StopChronoQuick(&chrono);
	return EXIT_TIMEOUT;
#else
	fd_set dev_set;
	int iResult = -1;
	struct timeval tv;

	UNREFERENCED_PARAMETER(checkingperiod);

	// Initialize a fd_set and add the socket to it.
	FD_ZERO(&dev_set);
	FD_SET((intptr_t)hDev, &dev_set);

	tv.tv_sec = (long)(timeout/1000);
	tv.tv_usec = (long)((timeout%1000)*1000);

	// Wait for the readability of the device in the fd_set, with a timeout.
	iResult = select((int)(intptr_t)hDev+1, &dev_set, NULL, NULL, &tv);

	// Remove the device from the set.
	FD_CLR((intptr_t)hDev, &dev_set);

	if (iResult == -1)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("WaitForComputerRS232Port error (%s) : %s"
			"(hDev=%#x, timeout=%d, checkingperiod=%d)\n",
			strtime_m(),
			"select failed. ",
			hDev, timeout, checkingperiod));
		return EXIT_FAILURE;
	}

	if (iResult == 0)
	{
		// The timeout on select() occured.
		return EXIT_TIMEOUT;
	}

	return EXIT_SUCCESS;
#endif // DISABLE_SELECT_OSCOMPUTERRS232PORT
#endif // _WIN32
}